

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

void __thiscall
Potassco::SmodelsConvert::SmData::addMinimize(SmData *this,Weight_t prio,WeightLitSpan *lits)

{
  iterator __position;
  vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *this_00;
  WeightLit_t *pWVar1;
  WeightLit_t x;
  WeightLit_t local_30;
  Weight_t local_24;
  
  local_24 = prio;
  this_00 = (vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
            std::
            map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
            ::operator[](&this->minimize_,&local_24);
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::reserve
            ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)this_00,
             (*(long *)(this_00 + 8) - *(long *)this_00 >> 3) + lits->size);
  if (lits->size != 0) {
    pWVar1 = lits->first;
    do {
      local_30 = *pWVar1;
      if ((long)local_30 < 0) {
        local_30.weight = -local_30.weight;
        local_30.lit = -local_30.lit;
      }
      __position._M_current = *(WeightLit_t **)(this_00 + 8);
      if (__position._M_current == *(WeightLit_t **)(this_00 + 0x10)) {
        std::vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
        _M_realloc_insert<Potassco::WeightLit_t_const&>(this_00,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      pWVar1 = pWVar1 + 1;
    } while (pWVar1 != lits->first + lits->size);
  }
  return;
}

Assistant:

void addMinimize(Weight_t prio, const WeightLitSpan& lits) {
		WLitVec& body = minimize_[prio];
		body.reserve(body.size() + size(lits));
		for (const WeightLit_t* it = begin(lits); it != end(lits); ++it) {
			WeightLit_t x = *it;
			if (weight(x) < 0) {
				x.lit = -x.lit;
				x.weight = -x.weight;
			}
			body.push_back(x);
		}
	}